

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

clip_image_size
llava_uhd::select_best_resolution
          (clip_image_size *original_size,
          vector<clip_image_size,_std::allocator<clip_image_size>_> *possible_resolutions)

{
  clip_image_size cVar1;
  clip_image_size *resolution;
  clip_image_size *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  
  cVar1 = *original_size;
  fVar8 = (float)cVar1.width;
  fVar9 = (float)cVar1.height;
  iVar3 = cVar1.height * cVar1.width;
  iVar5 = 0;
  iVar4 = 0x7fffffff;
  for (pcVar2 = (possible_resolutions->
                super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pcVar2 != (possible_resolutions->
                super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>)._M_impl.
                super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 1) {
    iVar7 = (*pcVar2).width;
    auVar11._0_4_ = (float)iVar7;
    iVar10 = (*pcVar2).height;
    auVar11._4_4_ = (float)iVar10;
    auVar11._8_8_ = 0;
    auVar12._4_4_ = fVar9;
    auVar12._0_4_ = fVar8;
    auVar12._8_8_ = 0;
    auVar12 = divps(auVar11,auVar12);
    fVar13 = auVar12._4_4_;
    if (auVar12._0_4_ <= auVar12._4_4_) {
      fVar13 = auVar12._0_4_;
    }
    iVar6 = (int)(fVar13 * fVar9) * (int)(fVar13 * fVar8);
    if (iVar3 < iVar6) {
      iVar6 = iVar3;
    }
    iVar7 = iVar10 * iVar7 - iVar6;
    if ((iVar5 < iVar6) || ((iVar6 == iVar5 && (iVar7 < iVar4)))) {
      cVar1 = *pcVar2;
      iVar5 = iVar6;
      iVar4 = iVar7;
    }
  }
  return cVar1;
}

Assistant:

static clip_image_size select_best_resolution(const clip_image_size & original_size, const std::vector<clip_image_size> & possible_resolutions) {
        int original_width = original_size.width;
        int original_height = original_size.height;
        clip_image_size best_fit;
        int max_effective_resolution = 0;
        int min_wasted_resolution = std::numeric_limits<int>::max();

        for (const auto & resolution : possible_resolutions) {
            int width  = resolution.width;
            int height = resolution.height;
            float scale = std::min(static_cast<float>(width) / original_width, static_cast<float>(height) / original_height);
            int downscaled_width  = static_cast<int>(original_width * scale);
            int downscaled_height = static_cast<int>(original_height * scale);
            int effective_resolution = std::min(downscaled_width * downscaled_height, original_width * original_height);
            int wasted_resolution = (width * height) - effective_resolution;
            // LOG_INF("resolution: %d %d, scale: %f, downscaled: %d %d, effective: %d, wasted: %d\n", width, height, scale, downscaled_width, downscaled_height, effective_resolution, wasted_resolution);
            if (effective_resolution > max_effective_resolution || (effective_resolution == max_effective_resolution && wasted_resolution < min_wasted_resolution)) {
                max_effective_resolution = effective_resolution;
                min_wasted_resolution = wasted_resolution;
                best_fit = resolution;
            }
        }

        return best_fit;
    }